

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

bool __thiscall
rengine::OpenGLRenderer::readPixels(OpenGLRenderer *this,int x,int y,int w,int h,uint *bytes)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < h) {
    uVar2 = (ulong)(uint)h;
  }
  iVar1 = h + y;
  while( true ) {
    iVar1 = iVar1 + -1;
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) break;
    glReadPixels(x,iVar1,w,1,0x1908,0x1401,bytes);
    bytes = bytes + w;
  }
  return true;
}

Assistant:

inline bool OpenGLRenderer::readPixels(int x, int y, int w, int h, unsigned *bytes)
{
    // Read line-by-line and flip it so we get what we want out..
    // Slow as hell, but this is used for autotesting, so who cares..
    for (int i=0; i<h; ++i)
        glReadPixels(x, y + h - i - 1, w, 1, GL_RGBA, GL_UNSIGNED_BYTE, bytes + i * w);
    return true;
}